

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

char * phosg::Image::mime_type_for_format(Format format)

{
  char *pcStack_10;
  Format format_local;
  
  if (format < WINDOWS_BITMAP) {
    pcStack_10 = "image/x-portable-pixmap";
  }
  else if (format == WINDOWS_BITMAP) {
    pcStack_10 = "image/bmp";
  }
  else if (format == PNG) {
    pcStack_10 = "image/png";
  }
  else {
    pcStack_10 = "text/plain";
  }
  return pcStack_10;
}

Assistant:

const char* Image::mime_type_for_format(Format format) {
  switch (format) {
    case Format::GRAYSCALE_PPM:
    case Format::COLOR_PPM:
      return "image/x-portable-pixmap";
    case Format::WINDOWS_BITMAP:
      return "image/bmp";
    case Format::PNG:
      return "image/png";
    default:
      return "text/plain";
  }
}